

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.c
# Opt level: O0

int xmllintShellRNGValidate
              (xmllintShellCtxtPtr sctxt,char *schemas,xmlNodePtr node,xmlNodePtr node2)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  int ret;
  xmlRelaxNGValidCtxtPtr vctxt;
  xmlRelaxNGParserCtxtPtr ctxt;
  xmlRelaxNGPtr relaxngschemas;
  xmlNodePtr node2_local;
  xmlNodePtr node_local;
  char *schemas_local;
  xmllintShellCtxtPtr sctxt_local;
  
  uVar2 = xmlRelaxNGNewParserCtxt(schemas);
  xmlRelaxNGSetParserErrors(uVar2,xmllintShellPrintf,xmllintShellPrintf,sctxt);
  lVar3 = xmlRelaxNGParse(uVar2);
  xmlRelaxNGFreeParserCtxt(uVar2);
  if (lVar3 == 0) {
    fprintf((FILE *)sctxt->output,"Relax-NG schema %s failed to compile\n",schemas);
    sctxt_local._4_4_ = -1;
  }
  else {
    uVar2 = xmlRelaxNGNewValidCtxt(lVar3);
    xmlRelaxNGSetValidErrors(uVar2,xmllintShellPrintf,xmllintShellPrintf,sctxt);
    iVar1 = xmlRelaxNGValidateDoc(uVar2,sctxt->doc);
    if (iVar1 == 0) {
      fprintf((FILE *)sctxt->output,"%s validates\n",sctxt->filename);
    }
    else if (iVar1 < 1) {
      fprintf((FILE *)sctxt->output,"%s validation generated an internal error\n",sctxt->filename);
    }
    else {
      fprintf((FILE *)sctxt->output,"%s fails to validate\n",sctxt->filename);
    }
    xmlRelaxNGFreeValidCtxt(uVar2);
    if (lVar3 != 0) {
      xmlRelaxNGFree(lVar3);
    }
    sctxt_local._4_4_ = 0;
  }
  return sctxt_local._4_4_;
}

Assistant:

static int
xmllintShellRNGValidate(xmllintShellCtxtPtr sctxt, char *schemas,
            xmlNodePtr node ATTRIBUTE_UNUSED,
	    xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlRelaxNGPtr relaxngschemas;
    xmlRelaxNGParserCtxtPtr ctxt;
    xmlRelaxNGValidCtxtPtr vctxt;
    int ret;

    ctxt = xmlRelaxNGNewParserCtxt(schemas);
    xmlRelaxNGSetParserErrors(ctxt, xmllintShellPrintf, xmllintShellPrintf, sctxt);
    relaxngschemas = xmlRelaxNGParse(ctxt);
    xmlRelaxNGFreeParserCtxt(ctxt);
    if (relaxngschemas == NULL) {
	fprintf(sctxt->output,
		"Relax-NG schema %s failed to compile\n", schemas);
	return(-1);
    }
    vctxt = xmlRelaxNGNewValidCtxt(relaxngschemas);
    xmlRelaxNGSetValidErrors(vctxt, xmllintShellPrintf, xmllintShellPrintf, sctxt);
    ret = xmlRelaxNGValidateDoc(vctxt, sctxt->doc);
    if (ret == 0) {
	fprintf(sctxt->output, "%s validates\n", sctxt->filename);
    } else if (ret > 0) {
	fprintf(sctxt->output, "%s fails to validate\n", sctxt->filename);
    } else {
	fprintf(sctxt->output, "%s validation generated an internal error\n",
	       sctxt->filename);
    }
    xmlRelaxNGFreeValidCtxt(vctxt);
    if (relaxngschemas != NULL)
	xmlRelaxNGFree(relaxngschemas);
    return(0);
}